

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall
CVmObjDict::del_word
          (CVmObjDict *this,vm_obj_id_t self,char *str,size_t len,vm_obj_id_t obj,
          vm_prop_id_t voc_prop)

{
  int iVar1;
  dict_undo_rec *pdVar2;
  vm_dict_ext *pvVar3;
  CVmObjDict *in_RCX;
  CVmObjDict *in_RDX;
  dict_undo_rec *in_RDI;
  dict_undo_action in_R8D;
  vm_prop_id_t in_R9W;
  dict_undo_rec *undo_rec;
  int deleted;
  size_t in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffd0;
  vm_prop_id_t in_stack_ffffffffffffffd2;
  vm_obj_id_t in_stack_ffffffffffffffd4;
  undefined2 in_stack_ffffffffffffffd8;
  
  iVar1 = del_hash_entry(in_RDX,(char *)in_RCX,
                         CONCAT44(in_R8D,CONCAT22(in_R9W,in_stack_ffffffffffffffd8)),
                         in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd2);
  if ((iVar1 != 0) && (G_undo_X != (CVmUndo *)0x0)) {
    pdVar2 = alloc_undo_rec(in_RCX,in_R8D,
                            (char *)CONCAT44(iVar1,CONCAT22(in_stack_ffffffffffffffd2,
                                                            in_stack_ffffffffffffffd0)),
                            in_stack_ffffffffffffffc8);
    pdVar2->obj = in_R8D;
    pdVar2->prop = in_R9W;
    add_undo_rec((CVmObjDict *)
                 CONCAT44(iVar1,CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)),
                 (vm_obj_id_t)((ulong)pdVar2 >> 0x20),in_RDI);
  }
  pvVar3 = get_ext((CVmObjDict *)in_RDI);
  pvVar3->modified_ = 1;
  return;
}

Assistant:

void CVmObjDict::del_word(VMG_ vm_obj_id_t self,
                          const char *str, size_t len,
                          vm_obj_id_t obj, vm_prop_id_t voc_prop)
{
    /* delete this entry */
    int deleted = del_hash_entry(vmg_ str, len, obj, voc_prop);

    /* 
     *   if there's a global undo object, and we actually deleted an
     *   entry, add undo for the change 
     */
    if (deleted && G_undo != 0)
    {
        dict_undo_rec *undo_rec;

        /* create the undo record */
        undo_rec = alloc_undo_rec(DICT_UNDO_DEL, str, len);
        undo_rec->obj = obj;
        undo_rec->prop = voc_prop;

        /* add the undo record */
        add_undo_rec(vmg_ self, undo_rec);
    }

    /* mark the object as modified since load */
    get_ext()->modified_ = TRUE;
}